

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResultTable.cpp
# Opt level: O3

void __thiscall celero::ResultTable::add(ResultTable *this,shared_ptr<celero::ExperimentResult> *x)

{
  _Tuple_impl<0UL,_celero::ResultTable::Impl_*,_std::default_delete<celero::ResultTable::Impl>_>
  _Var1;
  ulong uVar2;
  undefined8 uVar3;
  char cVar4;
  ostream *poVar5;
  Experiment *pEVar6;
  Statistics<long> *pSVar7;
  long lVar8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *entry;
  pointer ppVar9;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *entry_1;
  _Head_base<0UL,_celero::ResultTable::Impl_*,_false> _Var10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  shared_ptr<celero::UserDefinedMeasurementCollector> udmCollector;
  undefined1 local_80 [32];
  double local_60;
  string local_58;
  _Head_base<0UL,_celero::Experiment::Impl_*,_false> local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  _Var10._M_head_impl =
       (this->pimpl)._pimpl._M_t.
       super___uniq_ptr_impl<celero::ResultTable::Impl,_std::default_delete<celero::ResultTable::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_celero::ResultTable::Impl_*,_std::default_delete<celero::ResultTable::Impl>_>
       .super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>._M_head_impl;
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 != '\0') {
    if (*(char *)((long)_Var10._M_head_impl + 0x208) == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)_Var10._M_head_impl,
                 "Group,Experiment,Problem Space,Samples,Iterations,Failure,",0x3a);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 (this->pimpl)._pimpl._M_t.
                 super___uniq_ptr_impl<celero::ResultTable::Impl,_std::default_delete<celero::ResultTable::Impl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_celero::ResultTable::Impl_*,_std::default_delete<celero::ResultTable::Impl>_>
                 .super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>,
                 "Baseline,us/Iteration,Iterations/sec,",0x25);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 (this->pimpl)._pimpl._M_t.
                 super___uniq_ptr_impl<celero::ResultTable::Impl,_std::default_delete<celero::ResultTable::Impl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_celero::ResultTable::Impl_*,_std::default_delete<celero::ResultTable::Impl>_>
                 .super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>,
                 "T Min (us),T Mean (us),T Max (us),T Variance,T Standard Deviation,T Skewness,T Kurtosis,T Z Score,"
                 ,0x62);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 (this->pimpl)._pimpl._M_t.
                 super___uniq_ptr_impl<celero::ResultTable::Impl,_std::default_delete<celero::ResultTable::Impl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_celero::ResultTable::Impl_*,_std::default_delete<celero::ResultTable::Impl>_>
                 .super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>,
                 "R Min (us),R Mean (us),R Max (us),R Variance,R Standard Deviation,R Skewness,R Kurtosis,R Z Score,"
                 ,0x62);
      ExperimentResult::getUserDefinedMeasurements
                ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr);
      UserDefinedMeasurementCollector::getAggregateValues_abi_cxx11_
                ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                  *)local_80,(UserDefinedMeasurementCollector *)local_58._M_dataplus._M_p);
      uVar3 = local_80._8_8_;
      for (ppVar9 = (pointer)local_80._0_8_; ppVar9 != (pointer)uVar3; ppVar9 = ppVar9 + 1) {
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)
                            (this->pimpl)._pimpl._M_t.
                            super___uniq_ptr_impl<celero::ResultTable::Impl,_std::default_delete<celero::ResultTable::Impl>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_celero::ResultTable::Impl_*,_std::default_delete<celero::ResultTable::Impl>_>
                            .super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>,
                            (ppVar9->first)._M_dataplus._M_p,(ppVar9->first)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
      }
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 *)local_80);
      _Var1.super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>._M_head_impl =
           (this->pimpl)._pimpl._M_t.
           super___uniq_ptr_impl<celero::ResultTable::Impl,_std::default_delete<celero::ResultTable::Impl>_>
           ._M_t.
           super__Tuple_impl<0UL,_celero::ResultTable::Impl_*,_std::default_delete<celero::ResultTable::Impl>_>
           .super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>;
      cVar4 = (char)_Var1.super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>._M_head_impl;
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)_Var1.
                                       super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>.
                                       _M_head_impl + -0x18) + cVar4);
      std::ostream::put(cVar4);
      std::ostream::flush();
      _Var10._M_head_impl =
           (this->pimpl)._pimpl._M_t.
           super___uniq_ptr_impl<celero::ResultTable::Impl,_std::default_delete<celero::ResultTable::Impl>_>
           ._M_t.
           super__Tuple_impl<0UL,_celero::ResultTable::Impl_*,_std::default_delete<celero::ResultTable::Impl>_>
           .super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>._M_head_impl;
      *(bool *)((long)_Var10._M_head_impl + 0x208) = true;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
        _Var10._M_head_impl =
             (this->pimpl)._pimpl._M_t.
             super___uniq_ptr_impl<celero::ResultTable::Impl,_std::default_delete<celero::ResultTable::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_celero::ResultTable::Impl_*,_std::default_delete<celero::ResultTable::Impl>_>
             .super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>._M_head_impl;
      }
    }
    ExperimentResult::getExperiment
              ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    Experiment::getBenchmark((Experiment *)&local_38);
    Benchmark::getName_abi_cxx11_((string *)local_80,(Benchmark *)local_38._M_head_impl);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)_Var10._M_head_impl,(char *)local_80._0_8_,local_80._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
    pEVar6 = ExperimentResult::getExperiment
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    Experiment::getName_abi_cxx11_(&local_58,pEVar6);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_58._M_dataplus._M_p,local_58._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
    ExperimentResult::getProblemSpaceValue
              ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
    pEVar6 = ExperimentResult::getExperiment
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    Experiment::getSamples(pEVar6);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
    ExperimentResult::getProblemSpaceIterations
              ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
    ExperimentResult::getFailure
              ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    poVar5 = std::ostream::_M_insert<bool>(SUB81(poVar5,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)&local_58 + 0x10U)) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_80._0_8_ != (pointer)(local_80 + 0x10)) {
      operator_delete((void *)local_80._0_8_,(ulong)(local_80._16_8_ + 1));
    }
    if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
    }
    dVar11 = ExperimentResult::getBaselineMeasurement
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    poVar5 = std::ostream::_M_insert<double>(dVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
    dVar11 = ExperimentResult::getUsPerCall
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    poVar5 = std::ostream::_M_insert<double>(dVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
    dVar11 = ExperimentResult::getCallsPerSecond
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    poVar5 = std::ostream::_M_insert<double>(dVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
    _Var1.super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>._M_head_impl =
         (this->pimpl)._pimpl._M_t.
         super___uniq_ptr_impl<celero::ResultTable::Impl,_std::default_delete<celero::ResultTable::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_celero::ResultTable::Impl_*,_std::default_delete<celero::ResultTable::Impl>_>
         .super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>;
    ExperimentResult::getTimeStatistics
              ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    poVar5 = std::ostream::_M_insert<long>
                       ((long)_Var1.super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>.
                              _M_head_impl);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
    pSVar7 = ExperimentResult::getTimeStatistics
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    poVar5 = std::ostream::_M_insert<double>(pSVar7->M1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
    ExperimentResult::getTimeStatistics
              ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
    pSVar7 = ExperimentResult::getTimeStatistics
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    if (pSVar7->sampleSize < 2) {
      dVar11 = 0.0;
    }
    else {
      lVar8 = pSVar7->sampleSize - 1;
      auVar15._8_4_ = (int)((ulong)lVar8 >> 0x20);
      auVar15._0_8_ = lVar8;
      auVar15._12_4_ = 0x45300000;
      dVar11 = pSVar7->M2 /
               ((auVar15._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0));
    }
    poVar5 = std::ostream::_M_insert<double>(dVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
    pSVar7 = ExperimentResult::getTimeStatistics
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    if (pSVar7->sampleSize < 2) {
      dVar11 = 0.0;
    }
    else {
      lVar8 = pSVar7->sampleSize - 1;
      auVar16._8_4_ = (int)((ulong)lVar8 >> 0x20);
      auVar16._0_8_ = lVar8;
      auVar16._12_4_ = 0x45300000;
      dVar11 = pSVar7->M2 /
               ((auVar16._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0));
    }
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    poVar5 = std::ostream::_M_insert<double>(dVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
    pSVar7 = ExperimentResult::getTimeStatistics
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    uVar2 = pSVar7->sampleSize;
    dVar11 = 0.0;
    if (2 < uVar2) {
      auVar12._8_4_ = (int)(uVar2 >> 0x20);
      auVar12._0_8_ = uVar2;
      auVar12._12_4_ = 0x45300000;
      local_60 = SQRT((auVar12._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) * pSVar7->M3;
      dVar11 = pow(pSVar7->M2,1.5);
      dVar11 = local_60 / dVar11;
    }
    poVar5 = std::ostream::_M_insert<double>(dVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
    pSVar7 = ExperimentResult::getTimeStatistics
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    uVar2 = pSVar7->sampleSize;
    dVar11 = 0.0;
    if (3 < uVar2) {
      dVar14 = pSVar7->M2;
      if ((dVar14 != 0.0) || (NAN(dVar14))) {
        auVar17._8_4_ = (int)(uVar2 >> 0x20);
        auVar17._0_8_ = uVar2;
        auVar17._12_4_ = 0x45300000;
        dVar11 = (((auVar17._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) * pSVar7->M4) /
                 (dVar14 * dVar14) + -3.0;
      }
    }
    poVar5 = std::ostream::_M_insert<double>(dVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
    pSVar7 = ExperimentResult::getTimeStatistics
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    if (pSVar7->sampleSize < 2) {
      dVar11 = 0.0;
    }
    else {
      lVar8 = pSVar7->sampleSize - 1;
      auVar21._8_4_ = (int)((ulong)lVar8 >> 0x20);
      auVar21._0_8_ = lVar8;
      auVar21._12_4_ = 0x45300000;
      dVar11 = pSVar7->M2 /
               ((auVar21._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0));
    }
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    dVar14 = 0.0;
    if ((dVar11 != 0.0) || (NAN(dVar11))) {
      dVar14 = (pSVar7->M1 - (double)pSVar7->min) / dVar11;
    }
    poVar5 = std::ostream::_M_insert<double>(dVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
    _Var1.super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>._M_head_impl =
         (this->pimpl)._pimpl._M_t.
         super___uniq_ptr_impl<celero::ResultTable::Impl,_std::default_delete<celero::ResultTable::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_celero::ResultTable::Impl_*,_std::default_delete<celero::ResultTable::Impl>_>
         .super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>;
    ExperimentResult::getRAMStatistics
              ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    poVar5 = std::ostream::_M_insert<long>
                       ((long)_Var1.super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>.
                              _M_head_impl);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
    pSVar7 = ExperimentResult::getRAMStatistics
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    poVar5 = std::ostream::_M_insert<double>(pSVar7->M1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
    ExperimentResult::getRAMStatistics
              ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
    pSVar7 = ExperimentResult::getRAMStatistics
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    if (pSVar7->sampleSize < 2) {
      dVar11 = 0.0;
    }
    else {
      lVar8 = pSVar7->sampleSize - 1;
      auVar18._8_4_ = (int)((ulong)lVar8 >> 0x20);
      auVar18._0_8_ = lVar8;
      auVar18._12_4_ = 0x45300000;
      dVar11 = pSVar7->M2 /
               ((auVar18._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0));
    }
    poVar5 = std::ostream::_M_insert<double>(dVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
    pSVar7 = ExperimentResult::getRAMStatistics
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    if (pSVar7->sampleSize < 2) {
      dVar11 = 0.0;
    }
    else {
      lVar8 = pSVar7->sampleSize - 1;
      auVar19._8_4_ = (int)((ulong)lVar8 >> 0x20);
      auVar19._0_8_ = lVar8;
      auVar19._12_4_ = 0x45300000;
      dVar11 = pSVar7->M2 /
               ((auVar19._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0));
    }
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    poVar5 = std::ostream::_M_insert<double>(dVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
    pSVar7 = ExperimentResult::getRAMStatistics
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    uVar2 = pSVar7->sampleSize;
    dVar11 = 0.0;
    if (2 < uVar2) {
      auVar13._8_4_ = (int)(uVar2 >> 0x20);
      auVar13._0_8_ = uVar2;
      auVar13._12_4_ = 0x45300000;
      local_60 = SQRT((auVar13._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) * pSVar7->M3;
      dVar11 = pow(pSVar7->M2,1.5);
      dVar11 = local_60 / dVar11;
    }
    poVar5 = std::ostream::_M_insert<double>(dVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
    pSVar7 = ExperimentResult::getRAMStatistics
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    uVar2 = pSVar7->sampleSize;
    dVar11 = 0.0;
    if (3 < uVar2) {
      dVar14 = pSVar7->M2;
      if ((dVar14 != 0.0) || (NAN(dVar14))) {
        auVar20._8_4_ = (int)(uVar2 >> 0x20);
        auVar20._0_8_ = uVar2;
        auVar20._12_4_ = 0x45300000;
        dVar11 = (((auVar20._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) * pSVar7->M4) /
                 (dVar14 * dVar14) + -3.0;
      }
    }
    poVar5 = std::ostream::_M_insert<double>(dVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
    pSVar7 = ExperimentResult::getRAMStatistics
                       ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    if (pSVar7->sampleSize < 2) {
      dVar11 = 0.0;
    }
    else {
      lVar8 = pSVar7->sampleSize - 1;
      auVar22._8_4_ = (int)((ulong)lVar8 >> 0x20);
      auVar22._0_8_ = lVar8;
      auVar22._12_4_ = 0x45300000;
      dVar11 = pSVar7->M2 /
               ((auVar22._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0));
    }
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    dVar14 = 0.0;
    if ((dVar11 != 0.0) || (NAN(dVar11))) {
      dVar14 = (pSVar7->M1 - (double)pSVar7->min) / dVar11;
    }
    poVar5 = std::ostream::_M_insert<double>(dVar14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
    ExperimentResult::getUserDefinedMeasurements
              ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    UserDefinedMeasurementCollector::getAggregateValues_abi_cxx11_
              ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                *)local_80,(UserDefinedMeasurementCollector *)local_58._M_dataplus._M_p);
    for (; local_80._0_8_ != local_80._8_8_; local_80._0_8_ = local_80._0_8_ + 0x28) {
      poVar5 = std::ostream::_M_insert<double>(((pointer)local_80._0_8_)->second);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               *)local_80);
    _Var1.super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>._M_head_impl =
         (this->pimpl)._pimpl._M_t.
         super___uniq_ptr_impl<celero::ResultTable::Impl,_std::default_delete<celero::ResultTable::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_celero::ResultTable::Impl_*,_std::default_delete<celero::ResultTable::Impl>_>
         .super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>;
    cVar4 = (char)_Var1.super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>._M_head_impl;
    std::ios::widen((char)*(undefined8 *)
                           (*(long *)_Var1.super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>
                                     ._M_head_impl + -0x18) + cVar4);
    std::ostream::put(cVar4);
    std::ostream::flush();
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
    }
  }
  return;
}

Assistant:

void ResultTable::add(std::shared_ptr<celero::ExperimentResult> x)
{
	if(this->pimpl->ofs.is_open() == true)
	{
		if(this->pimpl->hasWrittenHeader == false)
		{
			// Print the header for the table.
			this->pimpl->ofs << "Group,Experiment,Problem Space,Samples,Iterations,Failure,";

			this->pimpl->ofs << "Baseline,us/Iteration,Iterations/sec,";

			this->pimpl->ofs << "T Min (us),T Mean (us),T Max (us),T Variance,T Standard Deviation,T Skewness,T Kurtosis,T Z Score,";
			this->pimpl->ofs << "R Min (us),R Mean (us),R Max (us),R Variance,R Standard Deviation,R Skewness,R Kurtosis,R Z Score,";

			// User Defined Metrics
			const auto udmCollector = x->getUserDefinedMeasurements();
			for(const auto& entry : udmCollector->getAggregateValues())
			{
				this->pimpl->ofs << entry.first << ",";
			}

			// Purposefully flushing the buffer here.
			this->pimpl->ofs << std::endl;

			this->pimpl->hasWrittenHeader = true;
		}

		// Description
		this->pimpl->ofs << x->getExperiment()->getBenchmark()->getName() << "," << x->getExperiment()->getName() << "," << x->getProblemSpaceValue()
						 << "," << x->getExperiment()->getSamples() << "," << x->getProblemSpaceIterations() << "," << x->getFailure() << ",";

		// Measurements
		this->pimpl->ofs << x->getBaselineMeasurement() << "," << x->getUsPerCall() << "," << x->getCallsPerSecond() << ",";

		// Statistics
		this->pimpl->ofs << x->getTimeStatistics().getMin() << "," << x->getTimeStatistics().getMean() << "," << x->getTimeStatistics().getMax()
						 << "," << x->getTimeStatistics().getVariance() << "," << x->getTimeStatistics().getStandardDeviation() << ","
						 << x->getTimeStatistics().getSkewness() << "," << x->getTimeStatistics().getKurtosis() << ","
						 << x->getTimeStatistics().getZScore() << ",";

		// Statistics
		this->pimpl->ofs << x->getRAMStatistics().getMin() << "," << x->getRAMStatistics().getMean() << "," << x->getRAMStatistics().getMax() << ","
						 << x->getRAMStatistics().getVariance() << "," << x->getRAMStatistics().getStandardDeviation() << ","
						 << x->getRAMStatistics().getSkewness() << "," << x->getRAMStatistics().getKurtosis() << ","
						 << x->getRAMStatistics().getZScore() << ",";

		// User Defined Metrics
		const auto udmCollector = x->getUserDefinedMeasurements();
		for(const auto& entry : udmCollector->getAggregateValues())
		{
			this->pimpl->ofs << entry.second << ",";
		}

		// Purposefully flushing the buffer here.
		this->pimpl->ofs << std::endl;
	}
}